

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O0

void __thiscall psy::C::SemanticModelTester::case0150(SemanticModelTester *this)

{
  bool bVar1;
  TypeKind TVar2;
  DeclarationCategory DVar3;
  SymbolKind SVar4;
  int iVar5;
  ostream *poVar6;
  void *pvVar7;
  undefined8 uVar8;
  Lexeme *pLVar9;
  Type *pTVar10;
  DeclaratorSyntax *pDVar11;
  undefined4 extraout_var;
  FunctionDeclarationSymbol *this_00;
  DeclarationSymbol *declSym;
  ArrayOrFunctionDeclaratorSyntax *arrOrFunDecltor;
  DeclaratorSyntax *decltor;
  string local_b8;
  FunctionDeclarationSymbol *local_98;
  FunctionDeclarationSymbol *funcDeclSym;
  type *semaModel;
  type *funcDefNode;
  string local_78 [55];
  allocator<char> local_41;
  string local_40;
  undefined1 local_20 [24];
  SemanticModelTester *this_local;
  
  local_20._16_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"void x ( ) { }",&local_41)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"",(allocator<char> *)((long)&funcDefNode + 7));
  compile<psy::C::FunctionDefinitionSyntax>
            ((SemanticModelTester *)local_20,(string *)this,&local_40);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&funcDefNode + 7));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  semaModel = (type *)std::
                      get<0ul,psy::C::FunctionDefinitionSyntax_const*,psy::C::SemanticModel_const*>
                                ((tuple<const_psy::C::FunctionDefinitionSyntax_*,_const_psy::C::SemanticModel_*>
                                  *)local_20);
  funcDeclSym = (FunctionDeclarationSymbol *)
                std::get<1ul,psy::C::FunctionDefinitionSyntax_const*,psy::C::SemanticModel_const*>
                          ((tuple<const_psy::C::FunctionDefinitionSyntax_*,_const_psy::C::SemanticModel_*>
                            *)local_20);
  local_98 = SemanticModel::functionFor
                       ((SemanticModel *)
                        (funcDeclSym->super_DeclarationSymbol).super_Symbol._vptr_Symbol,
                        (FunctionDefinitionSyntax *)*semaModel);
  if (local_98 == (FunctionDeclarationSymbol *)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpression is NOT ");
    poVar6 = std::operator<<(poVar6,"true");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,0x150);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&TestFailed::typeinfo,0);
  }
  pLVar9 = &FunctionDeclarationSymbol::name(local_98)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_b8,pLVar9);
  bVar1 = std::operator==(&local_b8,"x");
  std::__cxx11::string::~string((string *)&local_b8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tActual  : ");
    pLVar9 = &FunctionDeclarationSymbol::name(local_98)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_((string *)&decltor,pLVar9);
    poVar6 = std::operator<<(poVar6,(string *)&decltor);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpected: ");
    poVar6 = std::operator<<(poVar6,"x");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,0x151);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&decltor);
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&TestFailed::typeinfo,0);
  }
  pTVar10 = FunctionDeclarationSymbol::type(local_98);
  TVar2 = Type::kind(pTVar10);
  if (TVar2 != Function) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tActual  : ");
    pTVar10 = FunctionDeclarationSymbol::type(local_98);
    TVar2 = Type::kind(pTVar10);
    poVar6 = ::operator<<(poVar6,TVar2);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpected: ");
    poVar6 = ::operator<<(poVar6,Function);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,0x152);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&TestFailed::typeinfo,0);
  }
  pDVar11 = FunctionDefinitionSyntax::declarator((FunctionDefinitionSyntax *)*semaModel);
  iVar5 = (*(pDVar11->super_SyntaxNode).super_Managed._vptr_Managed[0x57])();
  this_00 = (FunctionDeclarationSymbol *)
            SemanticModel::declarationBy
                      ((SemanticModel *)
                       (funcDeclSym->super_DeclarationSymbol).super_Symbol._vptr_Symbol,
                       (DeclaratorSyntax *)CONCAT44(extraout_var,iVar5));
  if (this_00 == (FunctionDeclarationSymbol *)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpression is NOT ");
    poVar6 = std::operator<<(poVar6,"true");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,0x157);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&TestFailed::typeinfo,0);
  }
  DVar3 = DeclarationSymbol::category((DeclarationSymbol *)this_00);
  if (DVar3 != Function) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpression is NOT ");
    poVar6 = std::operator<<(poVar6,"true");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,0x158);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&TestFailed::typeinfo,0);
  }
  SVar4 = Symbol::kind((Symbol *)this_00);
  if (SVar4 != FunctionDeclaration) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpression is NOT ");
    poVar6 = std::operator<<(poVar6,"true");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,0x159);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&TestFailed::typeinfo,0);
  }
  if (this_00 != local_98) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tActual  : ");
    poVar6 = C::operator<<(poVar6,(DeclarationSymbol *)this_00);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpected: ");
    poVar6 = C::operator<<(poVar6,local_98);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,0x15a);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&TestFailed::typeinfo,0);
  }
  return;
}

Assistant:

void SemanticModelTester::case0150()
{
    auto [funcDefNode, semaModel] =
            compile<FunctionDefinitionSyntax>("void x ( ) { }");

    const FunctionDeclarationSymbol* funcDeclSym = semaModel->functionFor(funcDefNode);
    PSY_EXPECT_TRUE(funcDeclSym);
    PSY_EXPECT_EQ_STR(funcDeclSym->name()->valueText(), "x");
    PSY_EXPECT_EQ_ENU(funcDeclSym->type()->kind(), TypeKind::Function, TypeKind);

    auto decltor = funcDefNode->declarator();
    auto arrOrFunDecltor = decltor->asArrayOrFunctionDeclarator();
    const DeclarationSymbol* declSym = semaModel->declarationBy(arrOrFunDecltor);
    PSY_EXPECT_TRUE(declSym);
    PSY_EXPECT_TRUE(declSym->category() == DeclarationCategory::Function);
    PSY_EXPECT_TRUE(declSym->kind() == SymbolKind::FunctionDeclaration);
    PSY_EXPECT_EQ_PTR(declSym, funcDeclSym);
}